

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void __thiscall
BaseIndex::BaseIndex
          (BaseIndex *this,
          unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *chain,string *name
          )

{
  long lVar1;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  CThreadInterrupt *in_stack_ffffffffffffff98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CValidationInterface::CValidationInterface((CValidationInterface *)in_stack_ffffffffffffff98);
  *in_RDI = &PTR_UpdatedBlockTip_01613cc0;
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_ffffffffffffff98,false);
  std::atomic<bool>::atomic((atomic<bool> *)in_stack_ffffffffffffff98,false);
  std::atomic<const_CBlockIndex_*>::atomic
            ((atomic<const_CBlockIndex_*> *)in_stack_ffffffffffffff98,(__pointer_type)0x91a506);
  std::thread::thread((thread *)in_stack_ffffffffffffff98);
  CThreadInterrupt::CThreadInterrupt(in_stack_ffffffffffffff98);
  std::unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_>::unique_ptr
            ((unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)
             in_stack_ffffffffffffff98,
             (unique_ptr<interfaces::Chain,_std::default_delete<interfaces::Chain>_> *)0x91a53c);
  in_RDI[0x11] = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BaseIndex::BaseIndex(std::unique_ptr<interfaces::Chain> chain, std::string name)
    : m_chain{std::move(chain)}, m_name{std::move(name)} {}